

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_PerObjectMeshParameters * ON_PerObjectMeshParameters::Cast(ON_Object *p)

{
  bool bVar1;
  ON_PerObjectMeshParameters *local_18;
  ON_Object *p_local;
  
  if ((p == (ON_Object *)0x0) ||
     (bVar1 = ON_Object::IsKindOf(p,&m_ON_PerObjectMeshParameters_class_rtti),
     local_18 = (ON_PerObjectMeshParameters *)p, !bVar1)) {
    local_18 = (ON_PerObjectMeshParameters *)0x0;
  }
  return local_18;
}

Assistant:

ON_PerObjectMeshParameters* ON_PerObjectMeshParameters::FindOrCreate(const ON_Object* object,bool bCreate)
{
  if ( 0 == object )
    return 0;
  ON_PerObjectMeshParameters* ud = ON_PerObjectMeshParameters::Cast(object->GetUserData(ON_CLASS_ID(ON_PerObjectMeshParameters)));
  if ( !ud && bCreate )
  {
    ud = new ON_PerObjectMeshParameters();
    const_cast< ON_Object* >(object)->AttachUserData(ud);
  }
  return ud;
}